

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCodeEditor_UNIX.cxx
# Opt level: O3

int __thiscall ExternalCodeEditor::remove_tmpfile(ExternalCodeEditor *this)

{
  char *__file;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  stat buf;
  stat64 local_a0;
  
  __file = this->filename_;
  if (__file == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = stat64(__file,&local_a0);
    if ((-1 < iVar1) && ((local_a0.st_mode & 0xf000) == 0x8000)) {
      if (G_debug != 0) {
        printf("Removing tmpfile \'%s\'\n",__file);
      }
      iVar1 = remove(__file);
      if (iVar1 < 0) {
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        fl_alert("WARNING: Can\'t remove() \'%s\': %s",__file,pcVar3);
        return -1;
      }
    }
    if (this->filename_ != (char *)0x0) {
      free(this->filename_);
    }
    this->file_mtime_ = 0;
    this->file_size_ = 0;
    this->filename_ = (char *)0x0;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int is_dir(const char *dirname) {
  struct stat buf;
  if ( stat(dirname, &buf) < 0 ) return(0);
  return(S_ISDIR(buf.st_mode) ? 1 : 0);     // a dir?
}